

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  stbtt__point *psVar1;
  undefined4 in_ECX;
  float in_EDX;
  stbtt_vertex *in_RSI;
  stbtt__point *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  int in_XMM3_Da;
  int in_XMM4_Da;
  stbtt__bitmap *unaff_retaddr;
  void *in_stack_00000008;
  int in_stack_00000010;
  stbtt__point *windings;
  int *winding_lengths;
  int winding_count;
  float scale;
  undefined4 in_stack_fffffffffffffff0;
  
  psVar1 = stbtt_FlattenCurves(in_RSI,(int)in_EDX,in_XMM1_Da,(int **)CONCAT44(in_XMM2_Da,in_XMM3_Da)
                               ,(int *)CONCAT44(in_XMM4_Da,in_ECX),(void *)CONCAT44(in_R8D,in_R9D));
  if (psVar1 != (stbtt__point *)0x0) {
    stbtt__rasterize(unaff_retaddr,in_RDI,(int *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),
                     (int)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0),in_EDX,in_XMM1_Da,in_XMM2_Da,
                     in_XMM3_Da,in_XMM4_Da,in_stack_00000010,windings);
    ImGui::MemFree(in_stack_00000008);
    ImGui::MemFree(in_stack_00000008);
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
   float scale            = scale_x > scale_y ? scale_y : scale_x;
   int winding_count      = 0;
   int *winding_lengths   = NULL;
   stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
   if (windings) {
      stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
      STBTT_free(winding_lengths, userdata);
      STBTT_free(windings, userdata);
   }
}